

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O2

void hash_table_display(hash_table_t *h,int32 showdisplay)

{
  char *__format;
  long lVar1;
  uint uVar2;
  hash_entry_s *phVar3;
  
  puts("Hash with chaining representation of the hash table");
  __format = "%p";
  if (showdisplay != 0) {
    __format = "%s";
  }
  uVar2 = 0;
  for (lVar1 = 0; lVar1 < h->size; lVar1 = lVar1 + 1) {
    if (h->table[lVar1].key != (char *)0x0) {
      phVar3 = h->table + lVar1;
      printf("|key:");
      printf(__format,phVar3->key);
      printf("|len:%zd|val=%ld|->",phVar3->len,phVar3->val);
      while( true ) {
        if (phVar3->next == (hash_entry_s *)0x0) {
          puts("NULL");
        }
        phVar3 = phVar3->next;
        if (phVar3 == (hash_entry_s *)0x0) break;
        printf("|key:");
        if (showdisplay != 0) {
          printf("%s",phVar3->key);
        }
        printf("|len:%zd|val=%ld|->",phVar3->len,phVar3->val);
        uVar2 = uVar2 + 1;
      }
      uVar2 = uVar2 + 1;
    }
  }
  printf("The total number of keys =%d\n",(ulong)uVar2);
  return;
}

Assistant:

void
hash_table_display(hash_table_t * h, int32 showdisplay)
{
    hash_entry_t *e;
    int i, j;
    j = 0;

    printf("Hash with chaining representation of the hash table\n");

    for (i = 0; i < h->size; i++) {
        e = &(h->table[i]);
        if (e->key != NULL) {
            printf("|key:");
            if (showdisplay)
                printf("%s", e->key);
            else
                printf("%p", e->key);

            printf("|len:%zd|val=%ld|->", e->len, (long)e->val);
            if (e->next == NULL) {
                printf("NULL\n");
            }
            j++;

            for (e = e->next; e; e = e->next) {
                printf("|key:");
                if (showdisplay)
                    printf("%s", e->key);

                printf("|len:%zd|val=%ld|->", e->len, (long)e->val);
                if (e->next == NULL) {
                    printf("NULL\n");
                }
                j++;
            }
        }
    }

    printf("The total number of keys =%d\n", j);
}